

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_reduce.hpp
# Opt level: O0

BBox<2> * __thiscall
Omega_h::
transform_reduce<Omega_h::IntIterator,Omega_h::GetBBoxOp<2>,Omega_h::BBox<2>,Omega_h::UniteOp<2>>
          (BBox<2> *__return_storage_ptr__,int param_2,int first,GetBBoxOp<2> *param_4,
          undefined8 param_5,undefined8 param_6,double init,double param_8,double param_9,
          double param_10)

{
  double local_2c8;
  double local_2c0;
  double local_250;
  BBox<2> c;
  type transform_local;
  GetBBoxOp<2> *transform_local_1;
  int local_210;
  int local_20c;
  IntIterator last_local;
  IntIterator first_local;
  double local_140 [8];
  int local_100;
  int local_fc;
  Int i;
  int local_ec;
  double *local_e8;
  int local_dc;
  double *local_d8;
  int local_cc;
  double *local_c8;
  int local_bc;
  double *local_b8;
  int local_ac;
  double *local_a8;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  int local_80;
  int local_7c;
  Int j;
  undefined8 local_70;
  Vector<2> v;
  
  entering_parallel = 1;
  local_210 = first;
  local_20c = param_2;
  GetBBoxOp<2>::GetBBoxOp((GetBBoxOp<2> *)(c.max.super_Few<double,_2>.array_ + 1),param_4);
  entering_parallel = 0;
  for (; _last_local = &local_210, local_20c != local_210; local_20c = local_20c + 1) {
    local_7c = local_20c;
    _j = c.max.super_Few<double,_2>.array_ + 1;
    for (local_80 = 0; local_80 < 2; local_80 = local_80 + 1) {
      v.super_Few<double,_2>.array_[1]._4_4_ = local_80;
      v.super_Few<double,_2>.array_[(long)local_80 + -1] =
           (double)(&(transform_local.coords.write_.shared_alloc_.alloc)->size)
                   [local_20c * 2 + local_80];
    }
    local_140[4] = (double)local_70;
    local_140[5] = v.super_Few<double,_2>.array_[0];
    local_140[6] = (double)local_70;
    local_140[7] = v.super_Few<double,_2>.array_[0];
    local_140[0] = init;
    local_140[1] = param_8;
    local_140[2] = param_9;
    local_140[3] = param_10;
    for (local_100 = 0; local_100 < 2; local_100 = local_100 + 1) {
      local_ac = local_100;
      local_a8 = local_140;
      local_98 = local_a8[local_100];
      local_bc = local_100;
      local_b8 = local_140 + 4;
      local_a0 = local_b8[local_100];
      local_2c0 = local_98;
      if (local_a0 < local_98) {
        local_2c0 = local_a0;
      }
      local_cc = local_100;
      local_c8 = &local_250;
      local_c8[local_100] = local_2c0;
      local_d8 = local_140 + 2;
      local_dc = local_100;
      local_88 = local_d8[local_100];
      local_e8 = local_140 + 6;
      local_ec = local_100;
      local_90 = local_e8[local_100];
      local_2c8 = local_88;
      if (local_88 < local_90) {
        local_2c8 = local_90;
      }
      _i = c.min.super_Few<double,_2>.array_ + 1;
      local_fc = local_100;
      _i[local_100] = local_2c8;
    }
    init = local_250;
    param_8 = c.min.super_Few<double,_2>.array_[0];
    param_9 = c.min.super_Few<double,_2>.array_[1];
    param_10 = c.max.super_Few<double,_2>.array_[0];
  }
  (__return_storage_ptr__->min).super_Few<double,_2>.array_[0] = init;
  (__return_storage_ptr__->min).super_Few<double,_2>.array_[1] = param_8;
  (__return_storage_ptr__->max).super_Few<double,_2>.array_[0] = param_9;
  (__return_storage_ptr__->max).super_Few<double,_2>.array_[1] = param_10;
  GetBBoxOp<2>::~GetBBoxOp((GetBBoxOp<2> *)(c.max.super_Few<double,_2>.array_ + 1));
  return __return_storage_ptr__;
}

Assistant:

Result transform_reduce(
    Iterator first, Iterator last, Result init, Op op, Tranform&& transform) {
  Omega_h::entering_parallel = true;
  auto const transform_local = std::move(transform);
  Omega_h::entering_parallel = false;
  for (; first != last; ++first) {
    init = op(std::move(init), transform_local(*first));
  }
  return init;
}